

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TargetType targetType;
  int iVar5;
  cmGeneratorTarget *pcVar6;
  cmLocalNinjaGenerator *pcVar7;
  undefined4 extraout_var;
  char *pcVar8;
  cmMakefile *this_01;
  string *psVar9;
  ulong uVar10;
  ostream *poVar11;
  cmGlobalNinjaGenerator *pcVar12;
  reference pvVar13;
  reference pbVar14;
  pointer pcVar15;
  cmOutputConverter *local_1ee8;
  string *local_1d48;
  cmOutputConverter *local_1c18;
  bool local_1b7a;
  allocator<char> local_1b61;
  string local_1b60;
  string local_1b40;
  string local_1b20;
  string local_1b00;
  undefined1 local_1ae0 [8];
  ostringstream description;
  undefined1 local_1968 [8];
  ostringstream comment;
  string local_17f0;
  undefined1 local_17d0 [8];
  string cmdLine;
  string *i_2;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1750;
  string local_1730;
  reference local_1710;
  string *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_16d0;
  string local_16b0;
  allocator<char> local_1689;
  string local_1688;
  string local_1668;
  allocator<char> local_1641;
  string local_1640;
  string local_1620;
  allocator<char> local_15f9;
  string local_15f8;
  string local_15d8;
  string local_15b8;
  undefined1 local_1598 [8];
  string run_iwyu;
  char *cppcheck;
  string cppcheck_prop;
  char *cpplint;
  string cpplint_prop;
  char *tidy;
  string tidy_prop;
  char *iwyu;
  string iwyu_prop;
  char *clauncher;
  string clauncher_prop;
  string compilerLauncher;
  string *compileCmd_1;
  undefined1 local_1468 [8];
  string cmdVar_1;
  string *compileCmd;
  string local_1438;
  allocator<char> local_1411;
  string local_1410;
  undefined1 local_13f0 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  allocator<char> local_1391;
  string local_1390;
  undefined1 local_1370 [8];
  string depfileFlags;
  string flagsName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310;
  allocator<char> local_12e9;
  string local_12e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  byte local_1243;
  byte local_1242;
  allocator<char> local_1241;
  string local_1240;
  byte local_121b;
  byte local_121a;
  allocator<char> local_1219;
  string local_1218;
  allocator<char> local_11f1;
  string local_11f0;
  undefined1 local_11d0 [8];
  string cl;
  string local_1190 [8];
  string cldeps;
  string depfile;
  string deptype;
  allocator<char> local_1109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1068;
  undefined1 local_1048 [8];
  string rspcontent;
  string rspfile;
  string local_1000;
  allocator<char> local_fd9;
  string local_fd8;
  allocator<char> local_fb1;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  ostringstream ddDesc;
  undefined1 local_db8 [8];
  ostringstream ddComment;
  string local_c40;
  undefined1 local_c20 [8];
  string ddCmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  undefined1 local_b40 [8];
  string cmake_1;
  string ddInput;
  undefined1 local_af8 [8];
  string ddRspContent;
  undefined1 local_ad0 [8];
  string ddRspFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  undefined1 local_a10 [8];
  ostringstream ppDesc;
  undefined1 local_898 [8];
  ostringstream ppComment;
  string local_720;
  undefined1 local_700 [8];
  string ppCmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_620 [8];
  string cmake;
  string *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  allocator<char> local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  undefined1 local_4c0 [8];
  string ppRspContent;
  string ppRspFile;
  string ppFlags;
  RuleVariables ppVars;
  undefined1 local_330 [8];
  string ppDepfile;
  string ppDeptype;
  string *ppCmd;
  undefined1 local_2c8 [8];
  string ppVar;
  string local_2a0;
  char *local_280;
  char *val;
  string launcher;
  string local_238;
  undefined1 local_218 [8];
  string tdi;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  undefined1 local_1d0 [8];
  string responseFlagVar;
  undefined1 local_1a8 [7];
  bool lang_supports_response;
  string responseFlag;
  allocator<char> local_171;
  undefined1 local_170 [8];
  string flags;
  cmMakefile *mf;
  undefined1 auStack_140 [6];
  bool needDyndep;
  bool explicitPP;
  RuleVariables vars;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  vars.SwiftPartialModules = (char *)lang;
  cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)auStack_140);
  pcVar6 = GetGeneratorTarget(this);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar6);
  _auStack_140 = (char *)std::__cxx11::string::c_str();
  pcVar6 = GetGeneratorTarget(this);
  targetType = cmGeneratorTarget::GetType(pcVar6);
  vars.CMTargetName = cmState::GetTargetTypeName(targetType);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.LinkLibraries = "$in";
  vars.Output = "$out";
  vars.LanguageCompileFlags = "$DEFINES";
  vars.Defines = "$INCLUDES";
  vars.CMTargetType = "$TARGET_PDB";
  vars.TargetPDB = "$TARGET_COMPILE_PDB";
  vars.Object = "$OBJECT_DIR";
  vars.ObjectDir = "$OBJECT_FILE_DIR";
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.SwiftPartialModules,"Swift");
  if (bVar2) {
    vars.FilterPrefix = "$SWIFT_AUXILIARY_SOURCES";
    vars.SwiftAuxiliarySources = "$SWIFT_MODULE_NAME";
    vars.SwiftModuleName = "$SWIFT_LIBRARY_NAME";
    vars.SwiftLibraryName = "$SWIFT_PARTIAL_MODULE";
    vars.SwiftPartialModule = "$SWIFT_PARTIAL_DOC";
  }
  bVar2 = NeedExplicitPreprocessing(this,(string *)vars.SwiftPartialModules);
  bVar3 = NeedDyndep(this,(string *)vars.SwiftPartialModules);
  flags.field_2._8_8_ = GetMakefile(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_170,"$FLAGS",&local_171);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::string((string *)local_1a8);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.SwiftPartialModules,"RC");
  local_1b7a = true;
  if (!bVar4) {
    local_1b7a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.SwiftPartialModules,"CUDA");
  }
  responseFlagVar.field_2._M_local_buf[0xf] = (local_1b7a ^ 0xffU) & 1;
  if ((responseFlagVar.field_2._M_local_buf[0xf] != 0) && (bVar4 = ForceResponseFile(this), bVar4))
  {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rulePlaceholderExpander,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rulePlaceholderExpander,"_RESPONSE_FILE_FLAG");
    std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
    psVar9 = cmMakefile::GetSafeDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_1d0);
    std::__cxx11::string::operator=((string *)local_1a8,(string *)psVar9);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_1a8,"@");
    }
    std::__cxx11::string::~string((string *)local_1d0);
  }
  pcVar7 = GetLocalGenerator(this);
  iVar5 = (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    ();
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )(tdi.field_2._M_local_buf + 8),(pointer)CONCAT44(extraout_var,iVar5));
  pcVar7 = GetLocalGenerator(this);
  GetTargetDependInfoPath
            ((string *)((long)&launcher.field_2 + 8),this,(string *)vars.SwiftPartialModules);
  ConvertToNinjaPath(&local_238,this,(string *)((long)&launcher.field_2 + 8));
  cmOutputConverter::ConvertToOutputFormat
            ((string *)local_218,
             &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_238,SHELL);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&val);
  pcVar7 = GetLocalGenerator(this);
  pcVar6 = GetGeneratorTarget(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"RULE_LAUNCH_COMPILE",
             (allocator<char> *)(ppVar.field_2._M_local_buf + 0xf));
  pcVar8 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar7,pcVar6,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)(ppVar.field_2._M_local_buf + 0xf));
  local_280 = pcVar8;
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::string::operator=((string *)&val,pcVar8);
    std::__cxx11::string::operator+=((string *)&val," ");
  }
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppCmd,
                   "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            vars.SwiftPartialModules);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppCmd,
                   "_PREPROCESS_SOURCE");
    std::__cxx11::string::~string((string *)&ppCmd);
    this_01 = GetMakefile(this);
    psVar9 = cmMakefile::GetRequiredDefinition(this_01,(string *)local_2c8);
    std::__cxx11::string::string((string *)(ppDepfile.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,"$DEP_FILE",
               (allocator<char> *)((long)&ppVars.SwiftPartialModules + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ppVars.SwiftPartialModules + 7));
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&ppFlags.field_2 + 8));
    ppFlags.field_2._8_8_ = _auStack_140;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.TargetVersionMinor = vars.TargetVersionMinor;
    ppVars.Output = "$out";
    ppVars.AssemblySource = "$out";
    ppVars.Includes = (char *)std::__cxx11::string::c_str();
    ppVars.LinkLibraries = vars.LinkLibraries;
    vars.LinkLibraries = "$in";
    std::__cxx11::string::string((string *)(ppRspFile.field_2._M_local_buf + 8),(string *)local_170)
    ;
    ppVars.LanguageCompileFlags = vars.LanguageCompileFlags;
    vars.LanguageCompileFlags = "";
    ppVars.Defines = vars.Defines;
    std::__cxx11::string::string((string *)(ppRspContent.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_4c0);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::string::operator=((string *)(ppRspContent.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_580," ",&local_581);
      std::operator+(&local_560,&local_580,ppVars.LanguageCompileFlags);
      std::operator+(&local_540,&local_560," ");
      std::operator+(&local_520,&local_540,ppVars.Defines);
      std::operator+(&local_500,&local_520," ");
      std::operator+(&local_4e0,&local_500,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ppRspFile.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_580);
      std::allocator<char>::~allocator(&local_581);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ppCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ppRspContent.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(ppRspFile.field_2._M_local_buf + 8),
                 (string *)
                 &ppCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &ppCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppVars.LanguageCompileFlags = "";
      ppVars.Defines = "";
    }
    ppVars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    cmSystemTools::ExpandListArgument
              (psVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar4) {
      pbVar14 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cmake.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     pbVar14);
      std::__cxx11::string::operator=((string *)pbVar14,(string *)(cmake.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cmake.field_2._M_local_buf + 8));
      pcVar15 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)((long)&tdi.field_2 + 8));
      pcVar7 = GetLocalGenerator(this);
      local_1c18 = (cmOutputConverter *)0x0;
      if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
        local_1c18 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar15,local_1c18,pbVar14,(RuleVariables *)((long)&ppFlags.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pcVar7 = GetLocalGenerator(this);
    psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_620,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar9,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                   " -E cmake_ninja_depends --tdi=");
    std::operator+(&local_6c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::operator+(&local_6a0,&local_6c0," --lang=");
    std::operator+(&local_680,&local_6a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules);
    std::operator+(&local_660,&local_680," --pp=$out --dep=$DEP_FILE");
    pcVar8 = "";
    if (bVar3) {
      pcVar8 = " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
    }
    std::operator+(&local_640,&local_660,pcVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)(ppCmdLine.field_2._M_local_buf + 8));
    pcVar7 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&local_720);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_700,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,&local_720,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
    poVar11 = std::operator<<((ostream *)local_898,"Rule for preprocessing ");
    poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
    std::operator<<(poVar11," files.");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a10);
    poVar11 = std::operator<<((ostream *)local_a10,"Building ");
    poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
    std::operator<<(poVar11," preprocessed $out");
    pcVar12 = GetGlobalGenerator(this);
    LanguagePreprocessRule(&local_a30,this,(string *)vars.SwiftPartialModules);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"",
               (allocator<char> *)
               ((long)&ddCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGlobalNinjaGenerator::AddRule
              (pcVar12,&local_a30,(string *)local_700,&local_a50,&local_a70,(string *)local_330,
               (string *)((long)&ppDepfile.field_2 + 8),(string *)((long)&ppRspContent.field_2 + 8),
               (string *)local_4c0,&local_a90,false);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ddCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a10);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
    std::__cxx11::string::~string((string *)local_700);
    std::__cxx11::string::~string((string *)local_620);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::string::~string((string *)(ppRspContent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(ppRspFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_330);
    std::__cxx11::string::~string((string *)(ppDepfile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2c8);
  }
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ddRspFile.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_ad0,"$out.rsp",
               (allocator<char> *)(ddRspContent.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ddRspContent.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_af8,"$in",(allocator<char> *)(ddInput.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ddInput.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmake_1.field_2 + 8),"@",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad0);
    pcVar7 = GetLocalGenerator(this);
    psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_b40,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar9,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ddCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b40,
                   " -E cmake_ninja_dyndep --tdi=");
    std::operator+(&local_be0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ddCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::operator+(&local_bc0,&local_be0," --lang=");
    std::operator+(&local_ba0,&local_bc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules);
    std::operator+(&local_b80,&local_ba0," --dd=$out ");
    std::operator+(&local_b60,&local_b80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmake_1.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&ddRspFile.field_2 + 8),&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b80);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)(ddCmdLine.field_2._M_local_buf + 8));
    pcVar7 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&local_c40);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_c20,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&ddRspFile.field_2 + 8),&local_c40,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db8);
    poVar11 = std::operator<<((ostream *)local_db8,"Rule to generate ninja dyndep files for ");
    poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
    std::operator<<(poVar11,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f30);
    poVar11 = std::operator<<((ostream *)local_f30,"Generating ");
    poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
    std::operator<<(poVar11," dyndep file $out");
    pcVar12 = GetGlobalGenerator(this);
    LanguageDyndepRule(&local_f50,this,(string *)vars.SwiftPartialModules);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fb0,"",&local_fb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd8,"",&local_fd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1000,"",(allocator<char> *)(rspfile.field_2._M_local_buf + 0xf));
    cmGlobalNinjaGenerator::AddRule
              (pcVar12,&local_f50,(string *)local_c20,&local_f70,&local_f90,&local_fb0,&local_fd8,
               (string *)local_ad0,(string *)local_af8,&local_1000,false);
    std::__cxx11::string::~string((string *)&local_1000);
    std::allocator<char>::~allocator((allocator<char> *)(rspfile.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_fd8);
    std::allocator<char>::~allocator(&local_fd9);
    std::__cxx11::string::~string((string *)&local_fb0);
    std::allocator<char>::~allocator(&local_fb1);
    std::__cxx11::string::~string((string *)&local_f90);
    std::__cxx11::string::~string((string *)&local_f70);
    std::__cxx11::string::~string((string *)&local_f50);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f30);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db8);
    std::__cxx11::string::~string((string *)local_c20);
    std::__cxx11::string::~string((string *)local_b40);
    std::__cxx11::string::~string((string *)(cmake_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_af8);
    std::__cxx11::string::~string((string *)local_ad0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&ddRspFile.field_2 + 8));
  }
  std::__cxx11::string::string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1048);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::__cxx11::string::operator=((string *)(rspcontent.field_2._M_local_buf + 8),"$RSP_FILE");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1108," ",&local_1109);
    std::operator+(&local_10e8,&local_1108,vars.LanguageCompileFlags);
    std::operator+(&local_10c8,&local_10e8," ");
    std::operator+(&local_10a8,&local_10c8,vars.Defines);
    std::operator+(&local_1088,&local_10a8," ");
    std::operator+(&local_1068,&local_1088,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::__cxx11::string::operator=((string *)local_1048,(string *)&local_1068);
    std::__cxx11::string::~string((string *)&local_1068);
    std::__cxx11::string::~string((string *)&local_1088);
    std::__cxx11::string::~string((string *)&local_10a8);
    std::__cxx11::string::~string((string *)&local_10c8);
    std::__cxx11::string::~string((string *)&local_10e8);
    std::__cxx11::string::~string((string *)&local_1108);
    std::allocator<char>::~allocator(&local_1109);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&deptype.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rspcontent.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)local_170,(string *)(deptype.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(deptype.field_2._M_local_buf + 8));
    vars.LanguageCompileFlags = "";
    vars.Defines = "";
  }
  std::__cxx11::string::string((string *)(depfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cldeps.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1190);
  if (!bVar2) {
    bVar2 = NeedDepTypeMSVC(this,(string *)vars.SwiftPartialModules);
    uVar1 = flags.field_2._8_8_;
    if (bVar2) {
      std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"msvc");
      std::__cxx11::string::clear();
      std::__cxx11::string::operator+=((string *)local_170," /showIncludes");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cl.field_2 + 8),"CMAKE_NINJA_CMCLDEPS_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vars.SwiftPartialModules);
      bVar2 = cmMakefile::IsOn((cmMakefile *)uVar1,(string *)((long)&cl.field_2 + 8));
      std::__cxx11::string::~string((string *)(cl.field_2._M_local_buf + 8));
      if (bVar2) {
        bVar2 = cmMakefile::GetIsSourceFileTryCompile((cmMakefile *)flags.field_2._8_8_);
        if (!bVar2) {
          std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"gcc");
          std::__cxx11::string::operator=((string *)(cldeps.field_2._M_local_buf + 8),"$DEP_FILE");
          uVar1 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          local_121a = 0;
          local_121b = 0;
          local_1242 = 0;
          local_1243 = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11f0,"CMAKE_C_COMPILER",&local_11f1);
          pcVar8 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_11f0);
          uVar1 = flags.field_2._8_8_;
          if (pcVar8 == (char *)0x0) {
            std::allocator<char>::allocator();
            local_1242 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1240,"CMAKE_CXX_COMPILER",&local_1241);
            local_1243 = 1;
            local_1d48 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_1240);
          }
          else {
            std::allocator<char>::allocator();
            local_121a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1218,"CMAKE_C_COMPILER",&local_1219);
            local_121b = 1;
            local_1d48 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_1218);
          }
          std::__cxx11::string::string((string *)local_11d0,(string *)local_1d48);
          if ((local_1243 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1240);
          }
          if ((local_1242 & 1) != 0) {
            std::allocator<char>::~allocator(&local_1241);
          }
          if ((local_121b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1218);
          }
          if ((local_121a & 1) != 0) {
            std::allocator<char>::~allocator(&local_1219);
          }
          std::__cxx11::string::~string((string *)&local_11f0);
          std::allocator<char>::~allocator(&local_11f1);
          std::__cxx11::string::operator=(local_1190,"\"");
          psVar9 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
          std::__cxx11::string::operator+=(local_1190,(string *)psVar9);
          std::operator+(&local_12c8,"\" ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         vars.SwiftPartialModules);
          std::operator+(&local_12a8,&local_12c8," ");
          std::operator+(&local_1288,&local_12a8,vars.LinkLibraries);
          std::operator+(&local_1268,&local_1288," $DEP_FILE $out \"");
          std::__cxx11::string::operator+=(local_1190,(string *)&local_1268);
          std::__cxx11::string::~string((string *)&local_1268);
          std::__cxx11::string::~string((string *)&local_1288);
          std::__cxx11::string::~string((string *)&local_12a8);
          std::__cxx11::string::~string((string *)&local_12c8);
          uVar1 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_12e8,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_12e9);
          psVar9 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_12e8);
          std::__cxx11::string::operator+=(local_1190,(string *)psVar9);
          std::__cxx11::string::~string((string *)&local_12e8);
          std::allocator<char>::~allocator(&local_12e9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flagsName.field_2 + 8),"\" \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_11d0);
          std::operator+(&local_1310,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flagsName.field_2 + 8),"\" ");
          std::__cxx11::string::operator+=(local_1190,(string *)&local_1310);
          std::__cxx11::string::~string((string *)&local_1310);
          std::__cxx11::string::~string((string *)(flagsName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_11d0);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"gcc");
        std::__cxx11::string::operator=((string *)(cldeps.field_2._M_local_buf + 8),"$DEP_FILE");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&depfileFlags.field_2 + 8),"CMAKE_DEPFILE_FLAGS_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vars.SwiftPartialModules);
        psVar9 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)flags.field_2._8_8_,
                            (string *)((long)&depfileFlags.field_2 + 8));
        std::__cxx11::string::string((string *)local_1370,(string *)psVar9);
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          cmsys::SystemTools::ReplaceString((string *)local_1370,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)local_1370,"<OBJECT>","$out");
          uVar1 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1390,"CMAKE_C_COMPILER",&local_1391);
          pcVar8 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_1390);
          cmsys::SystemTools::ReplaceString((string *)local_1370,"<CMAKE_C_COMPILER>",pcVar8);
          std::__cxx11::string::~string((string *)&local_1390);
          std::allocator<char>::~allocator(&local_1391);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &compileCmds.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1370);
          std::__cxx11::string::operator+=
                    ((string *)local_170,
                     (string *)
                     &compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::~string((string *)local_1370);
        std::__cxx11::string::~string((string *)(depfileFlags.field_2._M_local_buf + 8));
      }
    }
  }
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  vars.Includes = (char *)std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&cmdVar.field_2 + 8));
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.SwiftPartialModules,"CUDA");
  if (bVar2) {
    std::__cxx11::string::string((string *)local_13f0);
    pcVar6 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1410,"CUDA_SEPARABLE_COMPILATION",&local_1411);
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar6,&local_1410);
    std::__cxx11::string::~string((string *)&local_1410);
    std::allocator<char>::~allocator(&local_1411);
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_13f0,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    }
    else {
      pcVar6 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1438,"CUDA_PTX_COMPILATION",
                 (allocator<char> *)((long)&compileCmd + 7));
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar6,&local_1438);
      std::__cxx11::string::~string((string *)&local_1438);
      std::allocator<char>::~allocator((allocator<char> *)((long)&compileCmd + 7));
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_13f0,"CMAKE_CUDA_COMPILE_PTX_COMPILATION");
      }
      else {
        std::__cxx11::string::operator=((string *)local_13f0,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION")
        ;
      }
    }
    cmdVar_1.field_2._8_8_ =
         (size_type)cmMakefile::GetRequiredDefinition(flags.field_2._8_8_,(string *)local_13f0);
    cmSystemTools::ExpandListArgument
              ((string *)cmdVar_1.field_2._8_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_13f0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compileCmd_1,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compileCmd_1,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&compileCmd_1);
    psVar9 = cmMakefile::GetRequiredDefinition
                       ((cmMakefile *)flags.field_2._8_8_,(string *)local_1468);
    cmSystemTools::ExpandListArgument
              (psVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_1468);
  }
  std::__cxx11::string::string((string *)(clauncher_prop.field_2._M_local_buf + 8));
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar2) &&
     ((((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.SwiftPartialModules,"C"), bVar2 ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.SwiftPartialModules,"CXX"), bVar2)) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vars.SwiftPartialModules,"Fortran"), bVar2)) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftPartialModules,"CUDA"), bVar2)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clauncher,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules,"_COMPILER_LAUNCHER");
    iwyu_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&clauncher);
    if (((char *)iwyu_prop.field_2._8_8_ != (char *)0x0) &&
       (*(char *)iwyu_prop.field_2._8_8_ != '\0')) {
      std::__cxx11::string::operator=
                ((string *)(clauncher_prop.field_2._M_local_buf + 8),(char *)iwyu_prop.field_2._8_8_
                );
    }
    std::__cxx11::string::~string((string *)&clauncher);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar2) &&
     ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftPartialModules,"C"), bVar2 ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftPartialModules,"CXX"), bVar2)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iwyu,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules,"_INCLUDE_WHAT_YOU_USE");
    tidy_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&iwyu);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tidy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules,"_CLANG_TIDY");
    cpplint_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&tidy);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpplint,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules,"_CPPLINT");
    cppcheck_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&cpplint);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cppcheck,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftPartialModules,"_CPPCHECK");
    run_iwyu.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&cppcheck);
    if (((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) ||
       ((((cpplint_prop.field_2._8_8_ != 0 && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
         ((cppcheck_prop.field_2._8_8_ != 0 && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')))) ||
        (((char *)run_iwyu.field_2._8_8_ != (char *)0x0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')
         ))))) {
      pcVar7 = GetLocalGenerator(this);
      psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)local_1598,
                 &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar9,SHELL);
      std::__cxx11::string::operator+=((string *)local_1598," -E __run_co_compile");
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_1598," --launcher=");
        cmOutputConverter::EscapeForShell
                  (&local_15b8,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)((long)&clauncher_prop.field_2 + 8),false,
                   false,false);
        std::__cxx11::string::operator+=((string *)local_1598,(string *)&local_15b8);
        std::__cxx11::string::~string((string *)&local_15b8);
        std::__cxx11::string::clear();
      }
      if ((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1598," --iwyu=");
        pcVar7 = GetLocalGenerator(this);
        uVar1 = tidy_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15f8,(char *)uVar1,&local_15f9);
        cmOutputConverter::EscapeForShell
                  (&local_15d8,
                   &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_15f8,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1598,(string *)&local_15d8);
        std::__cxx11::string::~string((string *)&local_15d8);
        std::__cxx11::string::~string((string *)&local_15f8);
        std::allocator<char>::~allocator(&local_15f9);
      }
      if ((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1598," --tidy=");
        pcVar7 = GetLocalGenerator(this);
        uVar1 = cpplint_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1640,(char *)uVar1,&local_1641);
        cmOutputConverter::EscapeForShell
                  (&local_1620,
                   &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1640,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1598,(string *)&local_1620);
        std::__cxx11::string::~string((string *)&local_1620);
        std::__cxx11::string::~string((string *)&local_1640);
        std::allocator<char>::~allocator(&local_1641);
      }
      if ((cppcheck_prop.field_2._8_8_ != 0) && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1598," --cpplint=");
        pcVar7 = GetLocalGenerator(this);
        uVar1 = cppcheck_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1688,(char *)uVar1,&local_1689);
        cmOutputConverter::EscapeForShell
                  (&local_1668,
                   &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1688,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1598,(string *)&local_1668);
        std::__cxx11::string::~string((string *)&local_1668);
        std::__cxx11::string::~string((string *)&local_1688);
        std::allocator<char>::~allocator(&local_1689);
      }
      if ((run_iwyu.field_2._8_8_ != 0) && (*(char *)run_iwyu.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1598," --cppcheck=");
        pcVar7 = GetLocalGenerator(this);
        uVar1 = run_iwyu.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16d0,(char *)uVar1,
                   (allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmOutputConverter::EscapeForShell
                  (&local_16b0,
                   &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_16d0,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1598,(string *)&local_16b0);
        std::__cxx11::string::~string((string *)&local_16b0);
        std::__cxx11::string::~string((string *)&local_16d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if ((((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
          ((cppcheck_prop.field_2._8_8_ != 0 && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')))) ||
         ((run_iwyu.field_2._8_8_ != 0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')))) {
        std::__cxx11::string::operator+=((string *)local_1598," --source=$in");
      }
      std::__cxx11::string::operator+=((string *)local_1598," -- ");
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&cmdVar.field_2 + 8));
      std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
      std::__cxx11::string::~string((string *)local_1598);
    }
    std::__cxx11::string::~string((string *)&cppcheck);
    std::__cxx11::string::~string((string *)&cpplint);
    std::__cxx11::string::~string((string *)&tidy);
    std::__cxx11::string::~string((string *)&iwyu);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar2) && (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
    cmSystemTools::ExpandListArgument
              ((string *)((long)&clauncher_prop.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_1,true);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    i_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&i_1), bVar2) {
      local_1710 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_1);
      cmOutputConverter::EscapeForShell
                (&local_1730,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,local_1710,false,false,false);
      std::__cxx11::string::operator=((string *)local_1710,(string *)&local_1730);
      std::__cxx11::string::~string((string *)&local_1730);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    pvVar13 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cmdVar.field_2 + 8));
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&__range1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_1," ");
    std::operator+(&local_1750,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                   " ");
    std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_1750);
    std::__cxx11::string::~string((string *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if (!bVar2) {
    pvVar13 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
  }
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&cmdVar.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  i_2 = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i_2), bVar2) {
    pbVar14 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,pbVar14
                  );
    std::__cxx11::string::operator=((string *)pbVar14,(string *)(cmdLine.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cmdLine.field_2._M_local_buf + 8));
    pcVar15 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                            *)((long)&tdi.field_2 + 8));
    pcVar7 = GetLocalGenerator(this);
    local_1ee8 = (cmOutputConverter *)0x0;
    if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
      local_1ee8 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar15,local_1ee8,pbVar14,(RuleVariables *)auStack_140);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar7 = GetLocalGenerator(this);
  std::__cxx11::string::string((string *)&local_17f0);
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_17d0,pcVar7,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8),&local_17f0,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::~string((string *)&local_17f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1968);
  poVar11 = std::operator<<((ostream *)local_1968,"Rule for compiling ");
  poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
  std::operator<<(poVar11," files.");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ae0);
  poVar11 = std::operator<<((ostream *)local_1ae0,"Building ");
  poVar11 = std::operator<<(poVar11,(string *)vars.SwiftPartialModules);
  std::operator<<(poVar11," object $out");
  pcVar12 = GetGlobalGenerator(this);
  LanguageCompilerRule(&local_1b00,this,(string *)vars.SwiftPartialModules);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b60,"",&local_1b61);
  cmGlobalNinjaGenerator::AddRule
            (pcVar12,&local_1b00,(string *)local_17d0,&local_1b20,&local_1b40,
             (string *)((long)&cldeps.field_2 + 8),(string *)((long)&depfile.field_2 + 8),
             (string *)((long)&rspcontent.field_2 + 8),(string *)local_1048,&local_1b60,false);
  std::__cxx11::string::~string((string *)&local_1b60);
  std::allocator<char>::~allocator(&local_1b61);
  std::__cxx11::string::~string((string *)&local_1b40);
  std::__cxx11::string::~string((string *)&local_1b20);
  std::__cxx11::string::~string((string *)&local_1b00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ae0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1968);
  std::__cxx11::string::~string((string *)local_17d0);
  std::__cxx11::string::~string((string *)(clauncher_prop.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&cmdVar.field_2 + 8));
  std::__cxx11::string::~string(local_1190);
  std::__cxx11::string::~string((string *)(cldeps.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(depfile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1048);
  std::__cxx11::string::~string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)local_218);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)((long)&tdi.field_2 + 8));
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_170);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  if (lang == "Swift") {
    vars.SwiftAuxiliarySources = "$SWIFT_AUXILIARY_SOURCES";
    vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
    vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
    vars.SwiftPartialModule = "$SWIFT_PARTIAL_MODULE";
    vars.SwiftPartialDoc = "$SWIFT_PARTIAL_DOC";
  }

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const& ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    std::string ppRspFile;
    std::string ppRspContent;
    if (!responseFlag.empty()) {
      ppRspFile = "$RSP_FILE";
      ppRspContent = std::string(" ") + ppVars.Defines + " " +
        ppVars.Includes + " " + ppFlags;
      ppFlags = responseFlag + ppRspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake +
      " -E cmake_ninja_depends"
      " --tdi=" +
      tdi + " --lang=" + lang +
      " --pp=$out"
      " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguagePreprocessRule(lang), ppCmdLine, ppDesc.str(),
      ppComment.str(), ppDepfile, ppDeptype, ppRspFile, ppRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake +
                     " -E cmake_ninja_dyndep"
                     " --tdi=" +
                     tdi + " --lang=" + lang +
                     " --dd=$out"
                     " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // If using a response file, move defines, includes, and flags into it.
  std::string rspfile;
  std::string rspcontent;
  if (!responseFlag.empty()) {
    rspfile = "$RSP_FILE";
    rspcontent =
      std::string(" ") + vars.Defines + " " + vars.Includes + " " + flags;
    flags = responseFlag + rspfile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    for (std::string& i : args) {
      i = this->LocalGenerator->EscapeForShell(i);
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}